

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

string * __thiscall
boost::deflate::inflate_stream_test::corpus1_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,size_t n)

{
  int iVar1;
  size_t __i;
  long lVar2;
  result_type rVar3;
  ulong uVar4;
  uniform_int_distribution<unsigned_long> d1;
  uniform_int_distribution<unsigned_long> d0;
  mt19937 g;
  uniform_int_distribution<unsigned_long> local_13d8;
  uniform_int_distribution<unsigned_long> local_13c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  if (corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_);
    if (iVar1 != 0) {
      corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_._M_dataplus._M_p =
           (pointer)&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_,
                 "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_13b8._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar4 = 0x1571;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  local_13c8._M_param._M_b =
       corpus1[abi:cxx11](unsigned_long)::alphabet_abi_cxx11_._M_string_length - 1;
  local_13c8._M_param._M_a = 0;
  local_13d8._M_param._M_a = 1;
  local_13d8._M_param._M_b = 5;
  while ((inflate_stream_test *)__return_storage_ptr__->_M_string_length < this) {
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_13d8,&local_13b8,&local_13d8._M_param);
    std::uniform_int_distribution<unsigned_long>::operator()
              (&local_13c8,&local_13b8,&local_13c8._M_param);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,(char)rVar3)
    ;
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)this);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string corpus1(std::size_t n)
    {
        static std::string const alphabet{
            "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
        };
        std::string s;
        s.reserve(n + 5);
        std::mt19937 g;
        std::uniform_int_distribution<std::size_t> d0{
            0, alphabet.size() - 1};
        std::uniform_int_distribution<std::size_t> d1{
            1, 5};
        while(s.size() < n)
        {
            auto const rep = d1(g);
            auto const ch = alphabet[d0(g)];
            s.insert(s.end(), rep, ch);
        }
        s.resize(n);
        return s;
    }